

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotionImposed.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotionImposed::ArchiveOUT(ChLinkMotionImposed *this,ChArchiveOut *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunctionPosition>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotionImposed>(marchive);
  ChLinkMateGeneric::ArchiveOUT(&this->super_ChLinkMateGeneric,marchive);
  local_38._value = &this->position_function;
  local_38._name = "position_function";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunctionPosition>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunctionPosition> *)&this->rotation_function;
  local_38._name = "rotation_function";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunctionRotation>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunctionRotation>_> *)&local_38);
  return;
}

Assistant:

void ChLinkMotionImposed::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotionImposed>();

    // serialize parent class
    ChLinkMateGeneric::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(position_function);
	marchive << CHNVP(rotation_function);
}